

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localization_backend.cpp
# Opt level: O3

void __thiscall
booster::locale::localization_backend_manager::impl::actual_backend::actual_backend
          (actual_backend *this,
          vector<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
          *backends,vector<int,_std::allocator<int>_> *index)

{
  pointer psVar1;
  int iVar2;
  pointer psVar3;
  undefined4 extraout_var;
  uint uVar4;
  ulong uVar5;
  
  (this->super_localization_backend)._vptr_localization_backend =
       (_func_int **)&PTR__actual_backend_001cfc90;
  (this->backends_).
  super__Vector_base<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->backends_).
  super__Vector_base<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->backends_).
  super__Vector_base<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(&this->index_,index);
  std::
  vector<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
  ::resize(&this->backends_,
           (long)(backends->
                 super__Vector_base<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(backends->
                 super__Vector_base<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 4);
  psVar3 = (backends->
           super__Vector_base<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((backends->
      super__Vector_base<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != psVar3) {
    uVar4 = 1;
    uVar5 = 0;
    do {
      psVar1 = (this->backends_).
               super__Vector_base<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar2 = (*(psVar3[uVar5].
                 super___shared_ptr<booster::locale::localization_backend,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_vptr_localization_backend[2])();
      std::__shared_ptr<booster::locale::localization_backend,_(__gnu_cxx::_Lock_policy)2>::
      reset<booster::locale::localization_backend>
                (&psVar1[uVar5].
                  super___shared_ptr<booster::locale::localization_backend,_(__gnu_cxx::_Lock_policy)2>
                 ,(localization_backend *)CONCAT44(extraout_var,iVar2));
      uVar5 = (ulong)uVar4;
      psVar3 = (backends->
               super__Vector_base<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar4 = uVar4 + 1;
    } while (uVar5 < (ulong)((long)(backends->
                                   super__Vector_base<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4))
    ;
  }
  return;
}

Assistant:

actual_backend(std::vector<booster::shared_ptr<localization_backend> > const &backends,std::vector<int> const &index):
                    index_(index)
                {
                    backends_.resize(backends.size());
                    for(unsigned i=0;i<backends.size();i++) {
                        backends_[i].reset(backends[i]->clone());
                    }
                }